

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O3

FeatureOptions<wasm::Type::BasicType> * __thiscall
wasm::Random::FeatureOptions<wasm::Type::BasicType>::add<wasm::Type::BasicType>
          (FeatureOptions<wasm::Type::BasicType> *this,FeatureSet feature,BasicType option,
          BasicType rest)

{
  iterator __position;
  vector<wasm::Type::BasicType,std::allocator<wasm::Type::BasicType>> *this_00;
  FeatureOptions<wasm::Type::BasicType> *pFVar1;
  FeatureSet local_28;
  BasicType local_24;
  FeatureSet feature_local;
  BasicType option_local;
  
  _local_28 = CONCAT44(option,feature.features);
  this_00 = (vector<wasm::Type::BasicType,std::allocator<wasm::Type::BasicType>> *)
            std::
            map<wasm::FeatureSet,_std::vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>_>_>_>
            ::operator[](&this->options,&local_28);
  __position._M_current = *(BasicType **)(this_00 + 8);
  if (__position._M_current == *(BasicType **)(this_00 + 0x10)) {
    std::vector<wasm::Type::BasicType,std::allocator<wasm::Type::BasicType>>::
    _M_realloc_insert<wasm::Type::BasicType_const&>(this_00,__position,&local_24);
  }
  else {
    *__position._M_current = option;
    *(BasicType **)(this_00 + 8) = __position._M_current + 1;
  }
  pFVar1 = add<>(this,local_28,rest);
  return pFVar1;
}

Assistant:

FeatureOptions<T>& add(FeatureSet feature, T option, Ts... rest) {
      options[feature].push_back(option);
      return add(feature, rest...);
    }